

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiID __thiscall ImGuiWindow::GetIDNoKeepAlive(ImGuiWindow *this,char *str,char *str_end)

{
  ImGuiID id;
  uint *puVar1;
  size_t data_size;
  
  puVar1 = ImVector<unsigned_int>::back((ImVector<unsigned_int> *)&this->IDStack);
  data_size = (long)str_end - (long)str;
  if (str_end == (char *)0x0) {
    data_size = 0;
  }
  id = ImHashStr(str,data_size,*puVar1);
  if (GImGui->DebugHookIdInfo == id) {
    ImGui::DebugHookIdInfo(id,0xb,str,str_end);
  }
  return id;
}

Assistant:

ImGuiID ImGuiWindow::GetIDNoKeepAlive(const char* str, const char* str_end)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashStr(str, str_end ? (str_end - str) : 0, seed);
    ImGuiContext& g = *GImGui;
    if (g.DebugHookIdInfo == id)
        ImGui::DebugHookIdInfo(id, ImGuiDataType_String, str, str_end);
    return id;
}